

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O0

int testKNNValidatorWrongNumberOfLabels(void)

{
  KNearestNeighborsClassifier *nnModel_00;
  StringVector *this;
  ostream *poVar1;
  undefined1 local_a8 [8];
  Result res;
  KNearestNeighborsClassifier *nnModel;
  undefined1 local_40 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  CoreML::KNNValidatorTests::generateInterface((Model *)local_40);
  nnModel_00 = CoreML::Specification::Model::mutable_knearestneighborsclassifier((Model *)local_40);
  CoreML::KNNValidatorTests::setNumberOfNeighbors(nnModel_00,3,true);
  CoreML::KNNValidatorTests::addDataPoints(nnModel_00);
  CoreML::KNNValidatorTests::addStringLabels(nnModel_00);
  this = CoreML::Specification::KNearestNeighborsClassifier::mutable_stringclasslabels(nnModel_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&res.m_message._M_storage,"Idontwork",
             (allocator *)((long)&res.m_message.super__Rb_tree_node_base._M_right + 7));
  CoreML::Specification::StringVector::add_vector(this,(string *)&res.m_message._M_storage);
  std::__cxx11::string::~string((string *)&res.m_message._M_storage);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&res.m_message.super__Rb_tree_node_base._M_right + 7));
  CoreML::validate<(MLModelType)404>((Result *)local_a8,(Model *)local_40);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_a8);
  if (m1._oneof_case_[0]._0_1_) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xd2);
    poVar1 = std::operator<<(poVar1,": error: ");
    poVar1 = std::operator<<(poVar1,"!((res).good())");
    poVar1 = std::operator<<(poVar1," was false, expected true.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_a8);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m1._oneof_case_[0];
}

Assistant:

int testKNNValidatorWrongNumberOfLabels() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *nnModel = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(nnModel, 3, true);

    KNNValidatorTests::addDataPoints(nnModel);
    KNNValidatorTests::addStringLabels(nnModel);
    nnModel->mutable_stringclasslabels()->add_vector(std::string("Idontwork"));

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}